

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSpectralTransform.cpp
# Opt level: O2

int __thiscall TPZSTShiftOrigin<float>::ClassId(TPZSTShiftOrigin<float> *this)

{
  uint uVar1;
  int iVar2;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"TPZShiftOrigin",&local_39)
  ;
  uVar1 = Hash(&local_38);
  iVar2 = TPZSpectralTransform<float>::ClassId(&this->super_TPZSpectralTransform<float>);
  std::__cxx11::string::~string((string *)&local_38);
  return iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZSTShiftOrigin<TVar>::ClassId() const
{
  return Hash("TPZShiftOrigin") ^
    TPZSpectralTransform<TVar>::ClassId() << 1;
}